

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::list_reader_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_list *tlist)

{
  ostream *poVar1;
  t_type *t;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  undefined1 local_1e8 [8];
  string val;
  undefined1 local_1b8 [8];
  string desc;
  ostringstream out;
  t_list *tlist_local;
  t_st_generator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(desc.field_2._M_local_buf + 8));
  temp_name_abi_cxx11_((string *)local_1b8,this);
  temp_name_abi_cxx11_((string *)local_1e8,this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),"[|");
  poVar1 = std::operator<<(poVar1,(string *)local_1b8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  poVar1 = std::operator<<(poVar1,"| ");
  poVar1 = std::operator<<(poVar1,(string *)local_1b8);
  poVar1 = std::operator<<(poVar1," := iprot readListBegin.");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),(string *)&local_208);
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  poVar1 = std::operator<<(poVar1," := OrderedCollection new.");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_228);
  poVar1 = std::operator<<(poVar1,(string *)local_1b8);
  poVar1 = std::operator<<(poVar1," size timesRepeat: [");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),(string *)&local_248);
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  poVar1 = std::operator<<(poVar1," add: ");
  t = t_list::get_elem_type(tlist);
  read_val_abi_cxx11_(&local_268,this,t);
  std::operator<<(poVar1,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  t_generator::indent_down((t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&desc.field_2 + 8),"].");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_288);
  poVar1 = std::operator<<(poVar1,"iprot readListEnd.");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a8);
  poVar1 = std::operator<<(poVar1,(string *)local_1e8);
  std::operator<<(poVar1,"] value");
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(desc.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::list_reader(t_list* tlist) {
  std::ostringstream out;
  string desc = temp_name();
  string val = temp_name();

  out << "[|" << desc << " " << val << "| " << desc << " := iprot readListBegin." << endl;
  indent_up();

  out << indent() << val << " := OrderedCollection new." << endl << indent() << desc
      << " size timesRepeat: [" << endl;

  indent_up();
  out << indent() << val << " add: " << read_val(tlist->get_elem_type());
  indent_down();

  out << "]." << endl << indent() << "iprot readListEnd." << endl << indent() << val << "] value";
  indent_down();

  return out.str();
}